

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>::Setup
          (TextbookBoyerMooreWithLinearMap<char16_t> *this,ArenaAllocator *allocator,
          TextbookBoyerMooreSetup<char16_t> *setup)

{
  code *pcVar1;
  bool bVar2;
  Scheme SVar3;
  undefined4 *puVar4;
  int32 *piVar5;
  TextbookBoyerMooreSetup<char16_t> *setup_local;
  ArenaAllocator *allocator_local;
  TextbookBoyerMooreWithLinearMap<char16_t> *this_local;
  
  SVar3 = TextbookBoyerMooreSetup<char16_t>::GetScheme(setup);
  if (SVar3 != LinearScheme) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0x117,"(setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme)",
                       "setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0>::Set
            (&this->lastOccurrence,setup->numLinearChars,setup->linearChar,setup->lastOcc);
  piVar5 = TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix(allocator,setup->pat,setup->patLen,1);
  this->goodSuffix = piVar5;
  return;
}

Assistant:

void TextbookBoyerMooreWithLinearMap<C>::Setup(ArenaAllocator * allocator, TextbookBoyerMooreSetup<C> const& setup)
    {
        Assert(setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme);
        lastOccurrence.Set(setup.numLinearChars, setup.linearChar, setup.lastOcc);
        goodSuffix = TextbookBoyerMooreSetup<C>::GetGoodSuffix(allocator, setup.pat, setup.patLen);
    }